

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O0

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float in_stack_ffffffffffffff64;
  Mat *this_00;
  int local_80;
  Mat local_70;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = *(int *)(in_RSI + 0x28);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    this_00 = &local_70;
    Mat::channel(this_00,(int)in_stack_ffffffffffffff64);
    pfVar1 = Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x11b967);
    local_38 = pfVar1;
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
      if (local_38[local_80] <= 0.0 && local_38[local_80] != 0.0) {
        in_stack_ffffffffffffff64 = *(float *)(in_RDI + 0x80);
        dVar2 = std::exp((double)(ulong)(uint)local_38[local_80]);
        local_38[local_80] = in_stack_ffffffffffffff64 * (SUB84(dVar2,0) - 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = alpha * (exp(ptr[i]) - 1.f);
        }
    }

    return 0;
}